

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_pre_render_two_sub_cycles_Test::TestBody
          (PpuTest_pre_render_two_sub_cycles_Test *this)

{
  code *pcVar1;
  bool bVar2;
  pointer pIVar3;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  char *pcVar6;
  unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_> *this_00;
  char *in_R9;
  AssertHelper local_418;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3d8;
  Message local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_;
  int iStack_3a4;
  optional<n_e_s::core::Pixel> pixel;
  int i;
  Action<unsigned_char_(unsigned_short)> local_390;
  WithoutMatchers local_369;
  Matcher<unsigned_short> local_368;
  MockSpec<unsigned_char_(unsigned_short)> local_350;
  ReturnAction<int> local_330;
  Action<unsigned_char_(unsigned_short)> local_320;
  WithoutMatchers local_2f9;
  Matcher<unsigned_short> local_2f8;
  MockSpec<unsigned_char_(unsigned_short)> local_2e0;
  ReturnAction<int> local_2c0;
  Action<unsigned_char_(unsigned_short)> local_2b0;
  WithoutMatchers local_289;
  Matcher<unsigned_short> local_288;
  MockSpec<unsigned_char_(unsigned_short)> local_270;
  ReturnAction<int> local_250;
  Action<unsigned_char_(unsigned_short)> local_240;
  WithoutMatchers local_219;
  Matcher<unsigned_short> local_218;
  MockSpec<unsigned_char_(unsigned_short)> local_200;
  ReturnAction<int> local_1e0;
  Action<unsigned_char_(unsigned_short)> local_1d0;
  WithoutMatchers local_1a9;
  Matcher<unsigned_short> local_1a8;
  MockSpec<unsigned_char_(unsigned_short)> local_190;
  ReturnAction<int> local_170;
  Action<unsigned_char_(unsigned_short)> local_160;
  WithoutMatchers local_139;
  Matcher<unsigned_short> local_138;
  MockSpec<unsigned_char_(unsigned_short)> local_120;
  ReturnAction<int> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<int> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  InSequence local_15;
  PpuVram local_14;
  PpuMask local_11;
  InSequence seq;
  PpuTest_pre_render_two_sub_cycles_Test *pPStack_10;
  PpuTest_pre_render_two_sub_cycles_Test *this_local;
  
  (this->super_PpuTest).expected.scanline = 0x105;
  (this->super_PpuTest).registers.scanline = 0x105;
  pPStack_10 = this;
  n_e_s::core::PpuMask::Register(&local_11,'\b');
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ =
       (uchar)local_11.super_Register<unsigned_char>.value_;
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ =
       (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_;
  (this->super_PpuTest).expected.cycle = 0x11;
  n_e_s::core::PpuVram::Register(&local_14,2);
  (this->super_PpuTest).expected.vram_addr.super_Register<unsigned_short>.value_ =
       (unsigned_short)local_14.super_Register<unsigned_short>.value_;
  (this->super_PpuTest).expected.name_table = '\x02';
  (this->super_PpuTest).expected.name_table_latch = '\x03';
  (this->super_PpuTest).expected.pattern_table_shifter_hi = 0x4c80;
  (this->super_PpuTest).expected.pattern_table_latch_hi = 0x99;
  (this->super_PpuTest).expected.pattern_table_shifter_low = 0x4000;
  (this->super_PpuTest).expected.pattern_table_latch_low = 0x80;
  (this->super_PpuTest).expected.attribute_table_shifter_low = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_shifter_hi = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_latch = '\x03';
  this_00 = &(this->super_PpuTest).ppu;
  pIVar3 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                     (this_00);
  (*pIVar3->_vptr_IPpu[3])();
  pIVar3 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                     (this_00);
  (*pIVar3->_vptr_IPpu[3])(pIVar3,0x2005,0);
  testing::InSequence::InSequence(&local_15);
  testing::Matcher<unsigned_short>::Matcher(&local_50,0x2000);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_38,&(this->super_PpuTest).mmu.super_MockMmu,&local_50);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_38,local_5d,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x35d,"mmu","read_byte(0x2000)");
  testing::Return<int>((testing *)&local_90,2);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_80);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_90);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
  testing::Matcher<unsigned_short>::~Matcher(&local_50);
  testing::Matcher<unsigned_short>::Matcher(&local_c8,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_b0,&(this->super_PpuTest).mmu.super_MockMmu,&local_c8);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_b0,&local_c9,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x361,"mmu","read_byte(0x23C0)");
  testing::Return<int>((testing *)&local_100,0xab);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar5,&local_f0);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_100);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
  testing::Matcher<unsigned_short>::~Matcher(&local_c8);
  testing::Matcher<unsigned_short>::Matcher(&local_138,0x20);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_120,&(this->super_PpuTest).mmu.super_MockMmu,&local_138);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_120,&local_139,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x365,"mmu","read_byte(0x02 * 16u)");
  testing::Return<int>((testing *)&local_170,0x80);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_160,(ReturnAction *)&local_170);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_160);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_160);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_170);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_120);
  testing::Matcher<unsigned_short>::~Matcher(&local_138);
  testing::Matcher<unsigned_short>::Matcher(&local_1a8,0x28);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_190,&(this->super_PpuTest).mmu.super_MockMmu,&local_1a8);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_190,&local_1a9,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x368,"mmu","read_byte(0x02 * 16u + 8u)");
  testing::Return<int>((testing *)&local_1e0,0x99);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_1d0,(ReturnAction *)&local_1e0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_1d0);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1d0);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_1e0);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_190);
  testing::Matcher<unsigned_short>::~Matcher(&local_1a8);
  testing::Matcher<unsigned_short>::Matcher(&local_218,0x2001);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_200,&(this->super_PpuTest).mmu.super_MockMmu,&local_218);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_200,&local_219,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x36c,"mmu","read_byte(0x2001)");
  testing::Return<int>((testing *)&local_250,3);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_240,(ReturnAction *)&local_250);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_240);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_240);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_250);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_200);
  testing::Matcher<unsigned_short>::~Matcher(&local_218);
  testing::Matcher<unsigned_short>::Matcher(&local_288,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_270,&(this->super_PpuTest).mmu.super_MockMmu,&local_288);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_270,&local_289,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x370,"mmu","read_byte(0x23C0)");
  testing::Return<int>((testing *)&local_2c0,0xab);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_2b0,(ReturnAction *)&local_2c0);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar5,&local_2b0);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_2b0);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_2c0);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_270);
  testing::Matcher<unsigned_short>::~Matcher(&local_288);
  testing::Matcher<unsigned_short>::Matcher(&local_2f8,0x30);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_2e0,&(this->super_PpuTest).mmu.super_MockMmu,&local_2f8);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_2e0,&local_2f9,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x373,"mmu","read_byte(0x03 * 16u)");
  testing::Return<int>((testing *)&local_330,0x80);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_320,(ReturnAction *)&local_330);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_320);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_320);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_330);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_2e0);
  testing::Matcher<unsigned_short>::~Matcher(&local_2f8);
  testing::Matcher<unsigned_short>::Matcher(&local_368,0x38);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_350,&(this->super_PpuTest).mmu.super_MockMmu,&local_368);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_350,&local_369,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x375,"mmu","read_byte(0x03 * 16u + 8u)");
  testing::Return<int>
            ((testing *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x3a2))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color,0x99);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_390,
             (ReturnAction *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x3a2))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_390);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_390);
  testing::internal::ReturnAction<int>::~ReturnAction
            ((ReturnAction<int> *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x3a2))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_350);
  testing::Matcher<unsigned_short>::~Matcher(&local_368);
  testing::InSequence::~InSequence(&local_15);
  iStack_3a4 = 0;
  do {
    if (0x10 < iStack_3a4) {
      testing::internal::EqHelper::
      Compare<n_e_s::core::PpuRegisters,_n_e_s::core::PpuRegisters,_nullptr>
                ((EqHelper *)local_408,"expected","registers",&(this->super_PpuTest).expected,
                 &(this->super_PpuTest).registers);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
      if (!bVar2) {
        testing::Message::Message(&local_410);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
        testing::internal::AssertHelper::AssertHelper
                  (&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0x37d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_418,&local_410);
        testing::internal::AssertHelper::~AssertHelper(&local_418);
        testing::Message::~Message(&local_410);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
      return;
    }
    pIVar3 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                       (&(this->super_PpuTest).ppu);
    register0x00000000 = (*pIVar3->_vptr_IPpu[4])();
    bVar2 = std::optional<n_e_s::core::Pixel>::has_value
                      ((optional<n_e_s::core::Pixel> *)
                       ((long)&gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 6));
    local_3c1 = (bool)((bVar2 ^ 0xffU) & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar2) {
      testing::Message::Message(&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_3c0,
                 (AssertionResult *)"pixel.has_value()","true","false",in_R9);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar.message_);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x37a,pcVar6);
      testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_3d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    bVar2 = SCARRY4(iStack_3a4,1);
    iStack_3a4 = iStack_3a4 + 1;
  } while (!bVar2);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_F(PpuTest, pre_render_two_sub_cycles) {
    registers.scanline = expected.scanline = 261; // Start at pre-render
    registers.mask = expected.mask =
            PpuMask(0b0000'1000); // Enable background rendering

    expected.cycle = 17;
    // Vram should be increased at cycle 8 and 16
    expected.vram_addr = PpuVram(0x0002);
    expected.name_table = 0x02;
    expected.name_table_latch = 0x03;
    expected.pattern_table_shifter_hi = 0x4C80;
    expected.pattern_table_latch_hi = 0x99;
    expected.pattern_table_shifter_low = 0x4000;
    expected.pattern_table_latch_low = 0x80;
    expected.attribute_table_shifter_low = 0x7F80;
    expected.attribute_table_shifter_hi = 0x7F80;
    expected.attribute_table_latch = 0x03;

    // Clear scrolling
    ppu->write_byte(0x2005, 0);
    ppu->write_byte(0x2005, 0);

    {
        testing::InSequence seq;
        // First cycle.
        // Nametable on cycle 1 set to index 2
        EXPECT_CALL(mmu, read_byte(0x2000)).WillOnce(Return(0x02));

        // Attribute on cycle 3.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 5.
        // Each tile uses 16 bytes. So tile with index 2 starts at address 16*2.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u)).WillOnce(Return(0x80));
        // High byte on cycle 7
        // Second bit plane address is 8 bytes after the first bit plane.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u + 8u)).WillOnce(Return(0x99));

        // Second cycle.
        // Nametable on cycle 9 set to index 3
        EXPECT_CALL(mmu, read_byte(0x2001)).WillOnce(Return(0x03));

        // Attribute on cycle 11.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 13.
        EXPECT_CALL(mmu, read_byte(0x03 * 16u)).WillOnce(Return(0x80));
        // Pattern table high byte on cycle 15
        EXPECT_CALL(mmu, read_byte(0x03 * 16u + 8u)).WillOnce(Return(0x99));
    }

    for (int i = 0; i < 17; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }

    EXPECT_EQ(expected, registers);
}